

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::OnAuthenticatedDatagram(Connection *this)

{
  uint64_t in_stack_000001f0;
  UDPAddress *in_stack_000001f8;
  Connection *in_stack_00000200;
  
  OnAuthenticatedDatagram(in_stack_00000200,in_stack_000001f8,in_stack_000001f0);
  return;
}

Assistant:

void Connection::OnAuthenticatedDatagram(const UDPAddress& addr, uint64_t receiveUsec)
{
    // If peer address has changed:
    if (PeerAddressChangesAllowed && addr != Outgoing.GetPeerUDPAddress())
    {
        setPeerAddress(addr);
        PeerAddressChangesAllowed = false;
    }

    // Reset the data timer
    NoDataTimer.Start(receiveUsec);

    // Stop attaching connection request if connection is established
    Outgoing.StopHandshake();

    // Handle connection:
    if (ConnectionEstablished) {
        return;
    }

    // If P2P connection data is coming from the wrong source address:
    if (HolePuncher &&
        HolePuncher->SeenProbe &&
        HolePuncher->StartParams.WinTies &&
        addr != Outgoing.GetPeerUDPAddress())
    {
        Logger.Warning("Refusing to mark connection established until we receive data from the expected peer address. Data was from ", addr.address().to_string(), " : ", addr.port());
        return;
    }

    ConnectionEstablished = true;

    Logger.Debug("Connection established with ", addr.address().to_string(), " : ", addr.port());

    // Reset timers when connection is established
    resetTimers(SocketConfig->NoDataTimeoutUsec, true);

    // Force time sync timer to expire right away to send a time sync update on the next tick
    TimeSyncTimer.ForceExpire();

    // Invoke application OnConnect() callback
    ConnectionConfig.OnConnect(ConnectionConfig.AppContextPtr, GetTonkConnection());
}